

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O1

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  cmCTest *pcVar1;
  pointer pcVar2;
  cmState *this_00;
  char cVar3;
  size_type sVar4;
  bool bVar5;
  int iVar6;
  CURLcode CVar7;
  int iVar8;
  ostream *poVar9;
  CURL_conflict *data;
  long *plVar10;
  cmCTestScriptHandler *pcVar11;
  char *pcVar12;
  size_t sVar13;
  unsigned_long uVar14;
  pointer pcVar15;
  char *pcVar16;
  string *psVar17;
  long lVar18;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar19;
  size_type *psVar20;
  long *plVar21;
  undefined8 uVar22;
  string *arg;
  pointer pbVar23;
  pointer pbVar24;
  uint uVar25;
  uint uVar26;
  ulong uVar27;
  string retryDelay;
  string retryCount;
  string local_file;
  cmCTestSubmitHandlerVectorOfChar chunk;
  string upload_as;
  string remote_file;
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  ostringstream cmCTestLog_msg;
  string curlopt;
  string ofile;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  char error_buffer [1024];
  string local_890;
  byte local_869;
  string local_868;
  string local_848;
  string local_828;
  void *local_808;
  void *pvStack_800;
  long local_7f8;
  long *local_7f0;
  long local_7e8;
  long local_7e0;
  long lStack_7d8;
  string local_7d0;
  pointer local_7b0;
  curl_slist *local_7a8;
  Curl_easy *local_7a0;
  FILE *local_798;
  uint local_790;
  uint local_78c;
  void *local_788;
  void *pvStack_780;
  long local_778;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_768;
  undefined1 local_760 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_750 [6];
  ios_base local_6f0 [264];
  string local_5e8;
  string local_5c8;
  cmCTestSubmitHandlerVectorOfChar local_5a8;
  cmCTestSubmitHandlerVectorOfChar local_588;
  string local_568;
  string local_548;
  string local_528;
  string local_508;
  string *local_4e8;
  string *local_4e0;
  string *local_4d8;
  pointer local_4d0;
  double local_4c8;
  double local_4c0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_4b8;
  string local_498;
  string local_478;
  string local_458;
  char local_438 [1032];
  
  local_768 = files;
  local_4e8 = localprefix;
  local_4e0 = url;
  local_4d8 = remoteprefix;
  local_7a8 = curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  pbVar23 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar24 = (this->HttpHeaders).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (pbVar23 != pbVar24) {
    do {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_760,"   Add HTTP Header: \"",0x15);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_760,(pbVar23->_M_dataplus)._M_p,pbVar23->_M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\"",1);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,0,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x96,local_5e8._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
      std::ios_base::~ios_base(local_6f0);
      local_7a8 = curl_slist_append(local_7a8,(pbVar23->_M_dataplus)._M_p);
      pbVar23 = pbVar23 + 1;
    } while (pbVar23 != pbVar24);
  }
  curl_global_init(3);
  pcVar1 = (this->super_cmCTestGenericHandler).CTest;
  local_760._0_8_ = local_750;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"CurlOptions","");
  cmCTest::GetCTestConfiguration(&local_5e8,pcVar1,(string *)local_760);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_760._0_8_ != local_750) {
    operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
  }
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4b8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cmSystemTools::ExpandListArgument(&local_5e8,&local_4b8,false);
  pbVar23 = local_4b8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_4b8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    local_790 = 0;
    local_78c = 0;
  }
  else {
    uVar25 = 0;
    uVar26 = 0;
    pbVar24 = local_4b8.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      iVar6 = std::__cxx11::string::compare((char *)pbVar24);
      if (iVar6 == 0) {
        uVar25 = 1;
      }
      iVar6 = std::__cxx11::string::compare((char *)pbVar24);
      if (iVar6 == 0) {
        uVar26 = 1;
      }
      pbVar24 = pbVar24 + 1;
      local_790 = uVar26;
      local_78c = uVar25;
    } while (pbVar24 != pbVar23);
  }
  local_7b0 = (local_768->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
  local_4d0 = (local_768->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_finish;
  local_869 = local_7b0 == local_4d0;
  do {
    if ((bool)local_869) {
      curl_slist_free_all(local_7a8);
      curl_global_cleanup();
LAB_001a1afa:
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_4b8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5e8._M_dataplus._M_p != &local_5e8.field_2) {
        operator_delete(local_5e8._M_dataplus._M_p,local_5e8.field_2._M_allocated_capacity + 1);
      }
      return (bool)(local_869 & 1);
    }
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      cmCurlSetCAInfo_abi_cxx11_(&local_458,data,(char *)0x0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_458._M_dataplus._M_p != &local_458.field_2) {
        operator_delete(local_458._M_dataplus._M_p,local_458.field_2._M_allocated_capacity + 1);
      }
      if ((local_78c & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"  Set CURLOPT_SSL_VERIFYPEER to off\n",0x24);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb1,local_848._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      }
      if ((local_790 & 1) != 0) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"  Set CURLOPT_SSL_VERIFYHOST to off\n",0x24);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb7,local_848._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        curl_easy_setopt(data,CURLOPT_PROXY,(this->HTTPProxy)._M_dataplus._M_p);
        if (this->HTTPProxyType == 2) {
          uVar22 = 4;
        }
        else {
          if (this->HTTPProxyType != 3) {
            curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
            if ((this->HTTPProxyAuth)._M_string_length != 0) {
              curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,(this->HTTPProxyAuth)._M_dataplus._M_p);
            }
            goto LAB_0019fd14;
          }
          uVar22 = 5;
        }
        curl_easy_setopt(data,CURLOPT_PROXYTYPE,uVar22);
      }
LAB_0019fd14:
      bVar5 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar5) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,0x78);
      curl_easy_setopt(data,CURLOPT_PUT,1);
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,local_7a8);
      local_848._M_dataplus._M_p = (pointer)&local_848.field_2;
      pcVar2 = (local_7b0->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_848,pcVar2,pcVar2 + local_7b0->_M_string_length);
      bVar5 = cmsys::SystemTools::FileExists(&local_848);
      if (!bVar5) {
        local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
        pcVar2 = (local_4e8->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_7d0,pcVar2,pcVar2 + local_4e8->_M_string_length);
        std::__cxx11::string::append((char *)&local_7d0);
        plVar10 = (long *)std::__cxx11::string::_M_append
                                    ((char *)&local_7d0,(ulong)(local_7b0->_M_dataplus)._M_p);
        paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(plVar10 + 2);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)*plVar10 == paVar19) {
          local_750[0]._0_8_ = paVar19->_M_allocated_capacity;
          local_750[0]._8_8_ = plVar10[3];
          local_760._0_8_ = local_750;
        }
        else {
          local_750[0]._0_8_ = paVar19->_M_allocated_capacity;
          local_760._0_8_ =
               (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)*plVar10;
        }
        local_760._8_8_ = plVar10[1];
        *plVar10 = (long)paVar19;
        plVar10[1] = 0;
        *(undefined1 *)(plVar10 + 2) = 0;
        std::__cxx11::string::operator=((string *)&local_848,(string *)local_760);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._0_8_ != local_750) {
          operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
        }
      }
      cmsys::SystemTools::GetFilenameName((string *)local_760,local_7b0);
      plVar10 = (long *)std::__cxx11::string::replace
                                  ((ulong)local_760,0,(char *)0x0,
                                   (ulong)(local_4d8->_M_dataplus)._M_p);
      local_7d0._M_dataplus._M_p = (pointer)&local_7d0.field_2;
      psVar20 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar20) {
        local_7d0.field_2._M_allocated_capacity = *psVar20;
        local_7d0.field_2._8_8_ = plVar10[3];
      }
      else {
        local_7d0.field_2._M_allocated_capacity = *psVar20;
        local_7d0._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_7d0._M_string_length = plVar10[1];
      *plVar10 = (long)psVar20;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._0_8_ != local_750) {
        operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
      }
      poVar9 = this->LogFile;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\tUpload file: ",0xe);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_848._M_dataplus._M_p,local_848._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,local_7d0._M_dataplus._M_p,local_7d0._M_string_length);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      cmSystemTools::EncodeURL(&local_5c8,&local_7d0,true);
      psVar17 = local_4e0;
      std::__cxx11::string::find((char)local_4e0,0x3f);
      local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
      pcVar2 = (psVar17->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_890,pcVar2,pcVar2 + psVar17->_M_string_length);
      std::__cxx11::string::_M_replace_aux((ulong)&local_890,local_890._M_string_length,0,'\x01');
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_890);
      local_760._0_8_ = local_750;
      paVar19 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 == paVar19) {
        local_750[0]._0_8_ = paVar19->_M_allocated_capacity;
        local_750[0]._8_8_ = plVar10[3];
      }
      else {
        local_750[0]._0_8_ = paVar19->_M_allocated_capacity;
        local_760._0_8_ =
             (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)*plVar10;
      }
      local_760._8_8_ = plVar10[1];
      *plVar10 = (long)paVar19;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append(local_760,(ulong)local_5c8._M_dataplus._M_p)
      ;
      local_7f0 = &local_7e0;
      plVar21 = plVar10 + 2;
      if ((long *)*plVar10 == plVar21) {
        local_7e0 = *plVar21;
        lStack_7d8 = plVar10[3];
      }
      else {
        local_7e0 = *plVar21;
        local_7f0 = (long *)*plVar10;
      }
      local_7e8 = plVar10[1];
      *plVar10 = (long)plVar21;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._0_8_ != local_750) {
        operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890._M_dataplus._M_p != &local_890.field_2) {
        operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) {
        cmCTestCurl::cmCTestCurl((cmCTestCurl *)local_760,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::append((char *)&local_7f0);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"BuildName","");
        cmCTest::GetCTestConfiguration(&local_868,pcVar1,&local_828);
        cmCTestCurl::Escape(&local_890,(cmCTestCurl *)local_760,&local_868);
        std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_890._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_868._M_dataplus._M_p != &local_868.field_2) {
          operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_7f0);
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        local_828._M_dataplus._M_p = (pointer)&local_828.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_828,"Site","");
        cmCTest::GetCTestConfiguration(&local_868,pcVar1,&local_828);
        cmCTestCurl::Escape(&local_890,(cmCTestCurl *)local_760,&local_868);
        std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_890._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_868._M_dataplus._M_p != &local_868.field_2) {
          operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_828._M_dataplus._M_p != &local_828.field_2) {
          operator_delete(local_828._M_dataplus._M_p,local_828.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_7f0);
        cmCTest::GetCurrentTag_abi_cxx11_(&local_868,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_890,(cmCTestCurl *)local_760,&local_868);
        std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_890._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_868._M_dataplus._M_p != &local_868.field_2) {
          operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::append((char *)&local_7f0);
        cmCTest::GetTestModelString_abi_cxx11_(&local_868,(this->super_cmCTestGenericHandler).CTest)
        ;
        cmCTestCurl::Escape(&local_890,(cmCTestCurl *)local_760,&local_868);
        std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_890._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_868._M_dataplus._M_p != &local_868.field_2) {
          operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
        }
        pcVar11 = cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        if (pcVar11->CMake != (cmake *)0x0) {
          this_00 = (pcVar11->CMake->State)._M_t.
                    super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                    super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                    super__Head_base<0UL,_cmState_*,_false>._M_head_impl;
          local_890._M_dataplus._M_p = (pointer)&local_890.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_890,"SubProject","");
          pcVar12 = cmState::GetGlobalProperty(this_00,&local_890);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_dataplus._M_p != &local_890.field_2) {
            operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
          }
          if (pcVar12 != (char *)0x0) {
            std::__cxx11::string::append((char *)&local_7f0);
            local_868._M_dataplus._M_p = (pointer)&local_868.field_2;
            sVar13 = strlen(pcVar12);
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_868,pcVar12,pcVar12 + sVar13);
            cmCTestCurl::Escape(&local_890,(cmCTestCurl *)local_760,&local_868);
            std::__cxx11::string::_M_append((char *)&local_7f0,(ulong)local_890._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_890._M_dataplus._M_p != &local_890.field_2) {
              operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1
                             );
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_868._M_dataplus._M_p != &local_868.field_2) {
              operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1
                             );
            }
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_760);
      }
      std::__cxx11::string::append((char *)&local_7f0);
      local_760._0_8_ = local_750;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"InternalTest","");
      pcVar12 = cmCTestGenericHandler::GetOption
                          (&this->super_cmCTestGenericHandler,(string *)local_760);
      bVar5 = cmSystemTools::IsOn(pcVar12);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_760._0_8_ != local_750) {
        operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::__cxx11::string::append((char *)&local_7f0);
      }
      else {
        cmSystemTools::ComputeFileHash((string *)local_760,&local_848,AlgoMD5);
        std::__cxx11::string::_M_append((char *)&local_7f0,local_760._0_8_);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._0_8_ != local_750) {
          operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
        }
      }
      iVar6 = std::__cxx11::string::compare((char *)local_7b0);
      if (iVar6 == 0) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      bVar5 = cmsys::SystemTools::FileExists(&local_848);
      if (!bVar5) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"   Cannot find file: ",0x15);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_760,local_848._M_dataplus._M_p,
                            local_848._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x123,local_890._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        curl_easy_cleanup(data);
        curl_slist_free_all(local_7a8);
        curl_global_cleanup();
        if (local_7f0 != &local_7e0) {
          operator_delete(local_7f0,local_7e0 + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
          operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
          operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_848._M_dataplus._M_p != &local_848.field_2) {
          operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
        }
        goto LAB_001a1afa;
      }
      uVar14 = cmsys::SystemTools::FileLength(&local_848);
      local_798 = (FILE *)cmsys::SystemTools::Fopen(&local_848,"rb");
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_760,"   Upload file: ",0x10);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_760,local_848._M_dataplus._M_p,local_848._M_string_length
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," to ",4);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         (poVar9,(char *)local_7f0,local_7e8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," Size: ",7);
      poVar9 = std::ostream::_M_insert<unsigned_long>((ulong)poVar9);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pcVar1 = (this->super_cmCTestGenericHandler).CTest;
      std::__cxx11::stringbuf::str();
      cmCTest::Log(pcVar1,5,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                   ,0x130,local_890._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_890._M_dataplus._M_p != &local_890.field_2) {
        operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
      }
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
      std::ios_base::~ios_base(local_6f0);
      curl_easy_setopt(data,CURLOPT_URL,local_7f0);
      curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
      curl_easy_setopt(data,CURLOPT_READDATA,local_798);
      curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar14);
      curl_easy_setopt(data,CURLOPT_ERRORBUFFER,local_438);
      curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
      curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
      local_808 = (void *)0x0;
      pvStack_800 = (void *)0x0;
      local_7f8 = 0;
      local_778 = 0;
      local_788 = (void *)0x0;
      pvStack_780 = (void *)0x0;
      local_7a0 = data;
      curl_easy_setopt(data,CURLOPT_WRITEDATA,&local_808);
      curl_easy_setopt(local_7a0,CURLOPT_DEBUGDATA,&local_788);
      CVar7 = curl_easy_perform(local_7a0);
      if (local_808 != pvStack_800) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"CURL output: [",0xe);
        if (pvStack_800 != local_808) {
          std::ostream::write((char *)local_760,(long)local_808);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_760,"]",1);
        cVar3 = (char)(ostream *)local_760;
        std::ios::widen((char)*(undefined8 *)(local_760._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x156,local_890._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = (pointer)0x0;
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        uVar27 = (long)pvStack_800 - (long)local_808;
        if (uVar27 == 0) {
          pcVar15 = (pointer)0x0;
        }
        else {
          if ((long)uVar27 < 0) {
            std::__throw_bad_alloc();
          }
          pcVar15 = (pointer)operator_new(uVar27);
        }
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = pcVar15 + uVar27;
        sVar13 = (long)pvStack_800 - (long)local_808;
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start = pcVar15;
        if (sVar13 != 0) {
          local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
          _M_finish = pcVar15;
          memmove(pcVar15,local_808,sVar13);
        }
        local_588.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_finish = pcVar15 + sVar13;
        ParseResponse(this,&local_588);
        if (pcVar15 != (pointer)0x0) {
          operator_delete(pcVar15,uVar27);
        }
      }
      if (local_788 != pvStack_780) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"CURL debug output: [",0x14);
        if (pvStack_780 != local_788) {
          std::ostream::write((char *)local_760,(long)local_788);
          std::ostream::flush();
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_760,"]",1);
        cVar3 = (char)(ostream *)local_760;
        std::ios::widen((char)*(undefined8 *)(local_760._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,0,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x15f,local_890._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
      }
      if ((CVar7 != CURLE_OK) || (bVar5 = true, this->HasErrors == true)) {
        local_760._0_8_ = local_750;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"RetryDelay","");
        pcVar12 = cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)local_760);
        pcVar16 = "";
        if (pcVar12 != (char *)0x0) {
          local_508._M_dataplus._M_p = (pointer)&local_508.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_508,"RetryDelay","");
          pcVar16 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_508);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_890,pcVar16,(allocator<char> *)&local_868);
        if ((pcVar12 != (char *)0x0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_508._M_dataplus._M_p != &local_508.field_2)) {
          operator_delete(local_508._M_dataplus._M_p,local_508.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._0_8_ != local_750) {
          operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
        }
        local_760._0_8_ = local_750;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_760,"RetryCount","");
        pcVar12 = cmCTestGenericHandler::GetOption
                            (&this->super_cmCTestGenericHandler,(string *)local_760);
        pcVar16 = "";
        if (pcVar12 != (char *)0x0) {
          local_528._M_dataplus._M_p = (pointer)&local_528.field_2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_528,"RetryCount","");
          pcVar16 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_528);
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_868,pcVar16,(allocator<char> *)&local_828);
        if ((pcVar12 != (char *)0x0) &&
           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_528._M_dataplus._M_p != &local_528.field_2)) {
          operator_delete(local_528._M_dataplus._M_p,local_528.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_760._0_8_ != local_750) {
          operator_delete((void *)local_760._0_8_,local_750[0]._M_allocated_capacity + 1);
        }
        sVar4 = local_890._M_string_length;
        psVar17 = &local_890;
        if (local_890._M_string_length == 0) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          local_548._M_dataplus._M_p = (pointer)&local_548.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_548,"CTestSubmitRetryDelay","");
          psVar17 = &local_478;
          cmCTest::GetCTestConfiguration(psVar17,pcVar1,&local_548);
        }
        iVar6 = atoi((psVar17->_M_dataplus)._M_p);
        if (sVar4 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_478._M_dataplus._M_p != &local_478.field_2) {
            operator_delete(local_478._M_dataplus._M_p,local_478.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_548._M_dataplus._M_p != &local_548.field_2) {
            operator_delete(local_548._M_dataplus._M_p,local_548.field_2._M_allocated_capacity + 1);
          }
        }
        sVar4 = local_868._M_string_length;
        psVar17 = &local_868;
        if (local_868._M_string_length == 0) {
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          local_568._M_dataplus._M_p = (pointer)&local_568.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_568,"CTestSubmitRetryCount","");
          psVar17 = &local_498;
          cmCTest::GetCTestConfiguration(psVar17,pcVar1,&local_568);
        }
        iVar8 = atoi((psVar17->_M_dataplus)._M_p);
        if (sVar4 == 0) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_498._M_dataplus._M_p != &local_498.field_2) {
            operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_568._M_dataplus._M_p != &local_568.field_2) {
            operator_delete(local_568._M_dataplus._M_p,local_568.field_2._M_allocated_capacity + 1);
          }
        }
        if (0 < iVar8) {
          local_4c0 = (double)iVar6;
          local_4c8 = local_4c0 * 1000000000.0;
          iVar6 = 0;
          do {
            while( true ) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_760,"   Submit failed, waiting ",0x1a);
              poVar9 = std::ostream::_M_insert<double>(local_4c0);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," seconds...\n",0xc);
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x17a,local_828._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_828._M_dataplus._M_p != &local_828.field_2) {
                operator_delete(local_828._M_dataplus._M_p,
                                local_828.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
              std::ios_base::~ios_base(local_6f0);
              lVar18 = std::chrono::_V2::steady_clock::now();
              local_768 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)((double)lVar18 + local_4c8);
              while (lVar18 = std::chrono::_V2::steady_clock::now(),
                    (double)lVar18 < (double)local_768) {
                cmsys::SystemTools::Delay(100);
              }
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_760,"   Retry submission: Attempt ",0x1d);
              iVar6 = iVar6 + 1;
              poVar9 = (ostream *)std::ostream::operator<<(local_760,iVar6);
              std::__ostream_insert<char,std::char_traits<char>>(poVar9," of ",4);
              plVar10 = (long *)std::ostream::operator<<(poVar9,iVar8);
              std::ios::widen((char)*(undefined8 *)(*plVar10 + -0x18) + (char)plVar10);
              std::ostream::put((char)plVar10);
              std::ostream::flush();
              pcVar1 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::stringbuf::str();
              cmCTest::Log(pcVar1,2,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x184,local_828._M_dataplus._M_p,
                           (this->super_cmCTestGenericHandler).Quiet);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_828._M_dataplus._M_p != &local_828.field_2) {
                operator_delete(local_828._M_dataplus._M_p,
                                local_828.field_2._M_allocated_capacity + 1);
              }
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
              std::ios_base::~ios_base(local_6f0);
              fclose(local_798);
              local_798 = (FILE *)cmsys::SystemTools::Fopen(&local_848,"rb");
              curl_easy_setopt(local_7a0,CURLOPT_READDATA,local_798);
              if (pvStack_800 != local_808) {
                pvStack_800 = local_808;
              }
              if (pvStack_780 != local_788) {
                pvStack_780 = local_788;
              }
              this->HasErrors = false;
              CVar7 = curl_easy_perform(local_7a0);
              if (local_808 != pvStack_800) {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
                std::__ostream_insert<char,std::char_traits<char>>
                          ((ostream *)local_760,"CURL output: [",0xe);
                if (pvStack_800 != local_808) {
                  std::ostream::write((char *)local_760,(long)local_808);
                  std::ostream::flush();
                }
                std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_760,"]",1);
                cVar3 = (char)(ostream *)local_760;
                std::ios::widen((char)*(undefined8 *)(local_760._0_8_ + -0x18) + cVar3);
                std::ostream::put(cVar3);
                std::ostream::flush();
                pcVar1 = (this->super_cmCTestGenericHandler).CTest;
                std::__cxx11::stringbuf::str();
                cmCTest::Log(pcVar1,0,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                             ,0x195,local_828._M_dataplus._M_p,
                             (this->super_cmCTestGenericHandler).Quiet);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_828._M_dataplus._M_p != &local_828.field_2) {
                  operator_delete(local_828._M_dataplus._M_p,
                                  local_828.field_2._M_allocated_capacity + 1);
                }
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
                std::ios_base::~ios_base(local_6f0);
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = (pointer)0x0;
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish = (pointer)0x0;
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
                uVar27 = (long)pvStack_800 - (long)local_808;
                if (uVar27 == 0) {
                  pcVar15 = (pointer)0x0;
                }
                else {
                  if ((long)uVar27 < 0) {
                    std::__throw_bad_alloc();
                  }
                  pcVar15 = (pointer)operator_new(uVar27);
                }
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage = pcVar15 + uVar27;
                sVar13 = (long)pvStack_800 - (long)local_808;
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_start = pcVar15;
                if (sVar13 != 0) {
                  local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_finish = pcVar15;
                  memmove(pcVar15,local_808,sVar13);
                }
                local_5a8.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_finish = pcVar15 + sVar13;
                ParseResponse(this,&local_5a8);
                if (pcVar15 != (pointer)0x0) {
                  operator_delete(pcVar15,uVar27);
                }
              }
              if (CVar7 != CURLE_OK) break;
              CVar7 = CURLE_OK;
              if ((this->HasErrors != true) || (iVar8 <= iVar6)) goto LAB_001a147f;
            }
          } while (iVar6 < iVar8);
          CVar7 = CURLE_UNSUPPORTED_PROTOCOL;
        }
LAB_001a147f:
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_868._M_dataplus._M_p != &local_868.field_2) {
          operator_delete(local_868._M_dataplus._M_p,local_868.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        bVar5 = CVar7 == CURLE_OK;
      }
      fclose(local_798);
      if (bVar5) {
        curl_easy_cleanup(local_7a0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::operator+(&local_890,"   Uploaded: ",&local_848);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_760,local_890._M_dataplus._M_p,
                            local_890._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,2,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1bd,local_890._M_dataplus._M_p,(this->super_cmCTestGenericHandler).Quiet);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"   Error when uploading file: ",0x1e);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_760,local_848._M_dataplus._M_p,
                            local_848._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a3,local_890._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_760,"   Error message was: ",0x16);
        sVar13 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_760,local_438,sVar13);
        cVar3 = (char)(ostringstream *)local_760;
        std::ios::widen((char)*(undefined8 *)(local_760._0_8_ + -0x18) + cVar3);
        std::ostream::put(cVar3);
        std::ostream::flush();
        pcVar1 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::stringbuf::str();
        cmCTest::Log(pcVar1,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x1a5,local_890._M_dataplus._M_p,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_890._M_dataplus._M_p != &local_890.field_2) {
          operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
        std::ios_base::~ios_base(local_6f0);
        poVar9 = this->LogFile;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"   Error when uploading file: ",0x1e);
        poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                           (poVar9,local_848._M_dataplus._M_p,local_848._M_string_length);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        poVar9 = (ostream *)std::ostream::flush();
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   Error message was: ",0x16);
        sVar13 = strlen(local_438);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,local_438,sVar13);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if (local_808 != pvStack_800) {
          poVar9 = this->LogFile;
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"   Curl output was: ",0x14);
          if (pvStack_800 != local_808) {
            std::ostream::write((char *)poVar9,(long)local_808);
            std::ostream::flush();
          }
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_760);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_760,"CURL output: [",0xe);
          if (pvStack_800 != local_808) {
            std::ostream::write((char *)local_760,(long)local_808);
            std::ostream::flush();
          }
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_760,"]",1);
          cVar3 = (char)(ostream *)local_760;
          std::ios::widen((char)*(undefined8 *)(local_760._0_8_ + -0x18) + cVar3);
          std::ostream::put(cVar3);
          std::ostream::flush();
          pcVar1 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::stringbuf::str();
          cmCTest::Log(pcVar1,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1b2,local_890._M_dataplus._M_p,false);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_890._M_dataplus._M_p != &local_890.field_2) {
            operator_delete(local_890._M_dataplus._M_p,local_890.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_760);
          std::ios_base::~ios_base(local_6f0);
        }
        curl_easy_cleanup(local_7a0);
        curl_slist_free_all(local_7a8);
        curl_global_cleanup();
      }
      if (local_788 != (void *)0x0) {
        operator_delete(local_788,local_778 - (long)local_788);
      }
      if (local_808 != (void *)0x0) {
        operator_delete(local_808,local_7f8 - (long)local_808);
      }
      if (local_7f0 != &local_7e0) {
        operator_delete(local_7f0,local_7e0 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_5c8._M_dataplus._M_p != &local_5c8.field_2) {
        operator_delete(local_5c8._M_dataplus._M_p,local_5c8.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_7d0._M_dataplus._M_p != &local_7d0.field_2) {
        operator_delete(local_7d0._M_dataplus._M_p,local_7d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_848._M_dataplus._M_p != &local_848.field_2) {
        operator_delete(local_848._M_dataplus._M_p,local_848.field_2._M_allocated_capacity + 1);
      }
      if (!bVar5) goto LAB_001a1afa;
    }
    local_7b0 = local_7b0 + 1;
    local_869 = local_7b0 == local_4d0;
  } while( true );
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args;
  cmSystemTools::ExpandListArgument(curlopt, args);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                         SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT);

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = localprefix + "/" + file;
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as = url +
        ((url.find('?') == std::string::npos) ? '?' : '&') +
        "FileName=" + ofile;

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          const char* subproject =
            cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(subproject);
          }
        }
      }

      upload_as += "&MD5=";

      if (cmSystemTools::IsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = this->GetOption("RetryDelay") == nullptr
          ? ""
          : this->GetOption("RetryDelay");
        std::string retryCount = this->GetOption("RetryCount") == nullptr
          ? ""
          : this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}